

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

ReturnType __thiscall
pbrt::ParameterDictionary::lookupSingle<(pbrt::ParameterType)7>
          (ParameterDictionary *this,string *name,ReturnType defaultValue)

{
  ParsedParameter *param;
  Tuple3<pbrt::Normal3,_float> TVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *fmt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *this_00;
  size_t sVar3;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDI;
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  float in_XMM1_Da;
  Normal3f NVar6;
  vector<double,_pstd::pmr::polymorphic_allocator<double>_> *values;
  ParsedParameter *p;
  const_iterator __end2;
  const_iterator __begin2;
  ParsedParameterVector *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  double *in_stack_ffffffffffffff90;
  undefined8 local_c;
  float local_4;
  undefined1 auVar5 [56];
  
  local_c = vmovlpd_avx(in_ZMM0._0_16_);
  fmt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
        ::begin(in_RDI);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
         ::end(in_stack_ffffffffffffff80);
  do {
    local_4 = in_XMM1_Da;
    if (fmt == args) {
LAB_00754a5c:
      TVar1.z = local_4;
      TVar1.x = (float)(undefined4)local_c;
      TVar1.y = (float)local_c._4_4_;
      return (ReturnType)TVar1;
    }
    param = *(ParsedParameter **)fmt;
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (!bVar2) {
      bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      auVar5 = in_ZMM0._8_56_;
      if (!bVar2) {
        this_00 = ParameterTypeTraits<(pbrt::ParameterType)7>::GetValues(param);
        bVar2 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::empty
                          ((vector<double,_pstd::pmr::polymorphic_allocator<double>_> *)0x7549a0);
        if (bVar2) {
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RDI,(char *)fmt,args);
        }
        sVar3 = pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::size(this_00);
        if (3 < sVar3) {
          ErrorExit<std::__cxx11::string_const&>((FileLoc *)in_RDI,(char *)fmt,args);
        }
        param->lookedUp = true;
        pstd::vector<double,_pstd::pmr::polymorphic_allocator<double>_>::data(this_00);
        NVar6 = ParameterTypeTraits<(pbrt::ParameterType)7>::Convert
                          (in_stack_ffffffffffffff90,
                           (FileLoc *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88))
        ;
        local_4 = NVar6.super_Tuple3<pbrt::Normal3,_float>.z;
        auVar4._0_8_ = NVar6.super_Tuple3<pbrt::Normal3,_float>._0_8_;
        auVar4._8_56_ = auVar5;
        local_c = vmovlpd_avx(auVar4._0_16_);
        goto LAB_00754a5c;
      }
    }
    fmt = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &fmt->_M_string_length;
  } while( true );
}

Assistant:

typename ParameterTypeTraits<PT>::ReturnType ParameterDictionary::lookupSingle(
    const std::string &name,
    typename ParameterTypeTraits<PT>::ReturnType defaultValue) const {
    // Search _params_ for parameter _name_
    using traits = ParameterTypeTraits<PT>;
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != traits::typeName)
            continue;
        // Extract parameter values from _p_
        const auto &values = traits::GetValues(*p);

        // Issue error if incorrect number of parameter values were provided
        if (values.empty())
            ErrorExit(&p->loc, "No values provided for parameter \"%s\".", name);
        if (values.size() > traits::nPerItem)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);

        // Return parameter values as _ReturnType_
        p->lookedUp = true;
        return traits::Convert(values.data(), &p->loc);
    }

    return defaultValue;
}